

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O1

char * util_shortname(char *path)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *extraout_RAX;
  char *pcVar4;
  int extraout_EDX;
  long in_RSI;
  long lVar5;
  
  if (path != (char *)0x0) {
    pcVar3 = strrchr(path,0x2f);
    pcVar4 = pcVar3 + 1;
    if (pcVar3 == (char *)0x0) {
      pcVar4 = path;
    }
    return pcVar4;
  }
  util_shortname_cold_1();
  iVar1 = util_optind;
  if (extraout_EDX < 0x3a) {
    pcVar4 = extraout_RAX;
    if (extraout_EDX == -1) {
      lVar5 = (long)util_optind;
      iVar2 = strcmp(*(char **)(in_RSI + -8 + lVar5 * 8),"--");
      if (iVar2 == 0) {
        while (lVar5 = *(long *)(in_RSI + (long)util_optind * 8), lVar5 != 0) {
          util_optind = util_optind + 1;
          iVar1 = *(int *)path;
          *(int *)path = iVar1 + 1;
          *(long *)(in_RSI + (long)iVar1 * 8) = lVar5;
        }
        pcVar4 = (char *)0x0;
      }
      else {
        util_optind = iVar1 + 1;
        pcVar4 = *(char **)(in_RSI + lVar5 * 8);
        iVar1 = *(int *)path;
        *(int *)path = iVar1 + 1;
        *(char **)(in_RSI + (long)iVar1 * 8) = pcVar4;
      }
    }
    return pcVar4;
  }
  if (extraout_EDX == 0x3a) {
    util_getopt_default_cold_2();
  }
  else if (extraout_EDX != 0x3f) {
    if (extraout_EDX != 0x56) {
      return extraout_RAX;
    }
    goto LAB_00103569;
  }
  util_getopt_default_cold_1();
LAB_00103569:
  util_print_version();
  exit(0);
}

Assistant:

const char *
util_shortname(
    const char *path)
{
    const char *ret;
    if (!path) {
        fprintf(stderr, "%s: NULL path passed to short_name\n", argv0);
        abort();
    }
    ret = strrchr(path, '/');
#ifdef _WIN32
    {
        const char *p = strrchr(path, '\\');
        ret = MAX(ret, p);
    }
#endif
    return ret ? ret + 1 : path;
}